

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LaneBasedExecutionQueue.cpp
# Opt level: O3

QueueJob * __thiscall
anon_unknown.dwarf_22b373::PriorityQueueScheduler::getNextJob
          (QueueJob *__return_storage_ptr__,PriorityQueueScheduler *this)

{
  pointer pQVar1;
  _Manager_type p_Var2;
  _Invoker_type p_Var3;
  
  pQVar1 = (this->jobs).c.
           super__Vector_base<llbuild::basic::QueueJob,_std::allocator<llbuild::basic::QueueJob>_>.
           _M_impl.super__Vector_impl_data._M_start;
  __return_storage_ptr__->desc = pQVar1->desc;
  *(undefined8 *)&(__return_storage_ptr__->work).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->work).super__Function_base._M_functor + 8) = 0;
  (__return_storage_ptr__->work).super__Function_base._M_manager = (_Manager_type)0x0;
  (__return_storage_ptr__->work)._M_invoker = (_Invoker_type)0x0;
  p_Var2 = *(_Manager_type *)((long)&(pQVar1->work).super__Function_base + 0x10);
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&__return_storage_ptr__->work,(_Any_data *)&pQVar1->work,__clone_functor)
    ;
    p_Var3 = (pQVar1->work)._M_invoker;
    (__return_storage_ptr__->work).super__Function_base._M_manager =
         *(_Manager_type *)((long)&(pQVar1->work).super__Function_base + 0x10);
    (__return_storage_ptr__->work)._M_invoker = p_Var3;
  }
  std::
  priority_queue<llbuild::basic::QueueJob,_std::vector<llbuild::basic::QueueJob,_std::allocator<llbuild::basic::QueueJob>_>,_QueueJobLess>
  ::pop(&this->jobs);
  return __return_storage_ptr__;
}

Assistant:

QueueJob getNextJob() override {
    QueueJob job = jobs.top();
    jobs.pop();
    return job;
  }